

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp.cc
# Opt level: O0

void __thiscall fizplex::LP::add_value(LP *this,size_t row,size_t column,double value)

{
  size_t sVar1;
  double dVar2;
  double in_RDX;
  ulong in_RSI;
  size_t in_RDI;
  ColMatrix *in_XMM0_Qa;
  
  sVar1 = row_count((LP *)0x1e5c22);
  if (sVar1 <= in_RSI) {
    __assert_fail("row < row_count()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp.cc"
                  ,0x40,"void fizplex::LP::add_value(size_t, size_t, double)");
  }
  dVar2 = (double)column_count((LP *)0x1e5c63);
  if ((ulong)in_RDX < (ulong)dVar2) {
    ColMatrix::add_value(in_XMM0_Qa,in_RSI,in_RDI,in_RDX);
    return;
  }
  __assert_fail("column < column_count()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp.cc",
                0x41,"void fizplex::LP::add_value(size_t, size_t, double)");
}

Assistant:

void LP::add_value(size_t row, size_t column, double value) {
  assert(row < row_count());
  assert(column < column_count());

  A.add_value(row, column, value);
}